

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPlugin.cpp
# Opt level: O3

NullTestPlugin * NullTestPlugin::instance(void)

{
  int iVar1;
  
  if (instance()::_instance == '\0') {
    iVar1 = __cxa_guard_acquire(&instance()::_instance);
    if (iVar1 != 0) {
      instance::_instance.super_TestPlugin._vptr_TestPlugin =
           (_func_int **)&PTR__TestPlugin_003a8310;
      instance::_instance.super_TestPlugin.next_ = (TestPlugin *)0x0;
      SimpleString::SimpleString(&instance::_instance.super_TestPlugin.name_,"null");
      instance::_instance.super_TestPlugin.enabled_ = true;
      instance::_instance.super_TestPlugin._vptr_TestPlugin =
           (_func_int **)&PTR__TestPlugin_003a8420;
      __cxa_atexit(TestPlugin::~TestPlugin,&instance::_instance,&__dso_handle);
      __cxa_guard_release(&instance()::_instance);
    }
  }
  return &instance::_instance;
}

Assistant:

NullTestPlugin* NullTestPlugin::instance()
{
    static NullTestPlugin _instance;
    return &_instance;
}